

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O0

bool * inline_assertion_check<true,bool>(bool *val,char *file,int line,char *func,char *assertion)

{
  string_view func_00;
  string_view file_00;
  string_view assertion_00;
  char *in_RCX;
  int in_EDX;
  char *in_RSI;
  bool *in_RDI;
  size_t in_R8;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar1;
  size_t in_stack_fffffffffffffff0;
  char *pcVar2;
  
  pcVar2 = *(char **)(in_FS_OFFSET + 0x28);
  if ((*in_RDI & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90);
    iVar1 = in_EDX;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_EDX,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_EDX,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90);
    file_00._M_len._4_4_ = iVar1;
    file_00._M_len._0_4_ = in_stack_ffffffffffffffb0;
    file_00._M_str = in_RSI;
    func_00._M_str = in_RCX;
    func_00._M_len = in_R8;
    assertion_00._M_str = pcVar2;
    assertion_00._M_len = in_stack_fffffffffffffff0;
    assertion_fail(file_00,in_EDX,func_00,assertion_00);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar2) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T&& inline_assertion_check(LIFETIMEBOUND T&& val, [[maybe_unused]] const char* file, [[maybe_unused]] int line, [[maybe_unused]] const char* func, [[maybe_unused]] const char* assertion)
{
    if constexpr (IS_ASSERT
#ifdef ABORT_ON_FAILED_ASSUME
                  || true
#endif
    ) {
        if (!val) {
            assertion_fail(file, line, func, assertion);
        }
    }
    return std::forward<T>(val);
}